

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O1

ssize_t __thiscall
BufferInputSource::read(BufferInputSource *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  long lVar2;
  uchar *puVar3;
  logic_error *this_00;
  undefined4 in_register_00000034;
  type ii;
  void *i;
  
  lVar1 = this->cur_offset;
  if (-1 < lVar1) {
    lVar2 = this->max_offset;
    i = (void *)(lVar2 - lVar1);
    if (i == (void *)0x0 || lVar2 < lVar1) {
      (this->super_InputSource).last_offset = lVar2;
      __buf = (void *)0x0;
    }
    else {
      (this->super_InputSource).last_offset = lVar1;
      if ((long)i < 0) {
        QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error((longlong)i);
      }
      if (i < __buf) {
        __buf = i;
      }
      puVar3 = Buffer::getBuffer(this->buf);
      memcpy((void *)CONCAT44(in_register_00000034,__fd),puVar3 + this->cur_offset,(size_t)__buf);
      if ((long)__buf < 0) {
        QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error((unsigned_long)__buf);
      }
      this->cur_offset = this->cur_offset + (long)__buf;
    }
    return (ssize_t)__buf;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"INTERNAL ERROR: BufferInputSource offset < 0");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

size_t
BufferInputSource::read(char* buffer, size_t length)
{
    if (this->cur_offset < 0) {
        throw std::logic_error("INTERNAL ERROR: BufferInputSource offset < 0");
    }
    qpdf_offset_t end_pos = this->max_offset;
    if (this->cur_offset >= end_pos) {
        this->last_offset = end_pos;
        return 0;
    }

    this->last_offset = this->cur_offset;
    size_t len = std::min(QIntC::to_size(end_pos - this->cur_offset), length);
    memcpy(buffer, this->buf->getBuffer() + this->cur_offset, len);
    this->cur_offset += QIntC::to_offset(len);
    return len;
}